

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O3

void nn_pipebase_sent(nn_pipebase *self)

{
  if (self->outstate == '\x02') {
    self->outstate = '\x03';
    return;
  }
  if (self->outstate == '\x04') {
    self->outstate = '\x01';
    nn_fsm_raise(&self->fsm,&self->out,0x84c4);
    return;
  }
  nn_pipebase_sent_cold_1();
}

Assistant:

void nn_pipebase_sent (struct nn_pipebase *self)
{
    if (nn_fast (self->outstate == NN_PIPEBASE_OUTSTATE_SENDING)) {
        self->outstate = NN_PIPEBASE_OUTSTATE_SENT;
        return;
    }
    nn_assert (self->outstate == NN_PIPEBASE_OUTSTATE_ASYNC);
    self->outstate = NN_PIPEBASE_OUTSTATE_IDLE;
    nn_fsm_raise (&self->fsm, &self->out, NN_PIPE_OUT);
}